

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileFStream.cpp
# Opt level: O0

void __thiscall adios2::transport::FileFStream::WaitForOpen(FileFStream *this)

{
  bool bVar1;
  char *in_RDI;
  string *in_stack_00000038;
  FileFStream *in_stack_00000040;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa8;
  future<void> *in_stack_ffffffffffffffb0;
  string local_48 [32];
  string local_28 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffe0;
  char *in_stack_ffffffffffffffe8;
  
  if ((in_RDI[0x300] & 1U) != 0) {
    bVar1 = std::__basic_future<void>::valid((__basic_future<void> *)0xd59bb1);
    if (bVar1) {
      std::future<void>::get(in_stack_ffffffffffffffb0);
    }
    in_RDI[0x300] = '\0';
    std::operator+(in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
    std::operator+(in_stack_ffffffffffffffa8,in_RDI);
    CheckFile(in_stack_00000040,in_stack_00000038);
    std::__cxx11::string::~string(local_28);
    std::__cxx11::string::~string(local_48);
    in_RDI[0x6c] = '\x01';
  }
  return;
}

Assistant:

void FileFStream::WaitForOpen()
{
    if (m_IsOpening)
    {
        if (m_OpenFuture.valid())
        {
            m_OpenFuture.get();
        }
        m_IsOpening = false;
        CheckFile("couldn't open file " + m_Name +
                  ", check permissions or path existence, in call to POSIX open");
        m_IsOpen = true;
    }
}